

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::findPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  uint proxyId1;
  uint proxyId2;
  btBroadphasePair *pbVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  btBroadphasePair *pbVar5;
  btBroadphaseProxy *pbVar6;
  long lVar7;
  
  gFindPairs = gFindPairs + 1;
  pbVar6 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar6 = proxy0;
    proxy0 = proxy1;
  }
  proxyId1 = proxy0->m_uniqueId;
  proxyId2 = pbVar6->m_uniqueId;
  uVar2 = getHash(this,proxyId1,proxyId2);
  uVar3 = (long)(int)uVar2 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  if ((int)uVar3 < (this->m_hashTable).m_size) {
    pbVar1 = (this->m_overlappingPairArray).m_data;
    piVar4 = (this->m_hashTable).m_data + uVar3;
    while (lVar7 = (long)*piVar4, lVar7 != -1) {
      if (((pbVar1[lVar7].m_pProxy0)->m_uniqueId == proxyId1) &&
         (pbVar5 = pbVar1 + lVar7, pbVar5->m_pProxy1->m_uniqueId == proxyId2)) {
        return pbVar5;
      }
      piVar4 = (this->m_next).m_data + lVar7;
    }
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	gFindPairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	if (hash >= m_hashTable.size())
	{
		return NULL;
	}

	int index = m_hashTable[hash];
	while (index != BT_NULL_PAIR && equalsPair(m_overlappingPairArray[index], proxyId1, proxyId2) == false)
	{
		index = m_next[index];
	}

	if (index == BT_NULL_PAIR)
	{
		return NULL;
	}

	btAssert(index < m_overlappingPairArray.size());

	return &m_overlappingPairArray[index];
}